

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void grid_cb(Fl_Int_Input *i,long v)

{
  Fl_Window *this;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Fl_Type *pFVar7;
  
  pFVar7 = Fl_Type::first;
  if (v - 1U < 3) {
    iVar2 = atoi((i->super_Fl_Input).super_Fl_Input_.value_);
    iVar6 = 0;
    if (0 < iVar2) {
      iVar6 = iVar2;
    }
    iVar2 = *(int *)(&DAT_002141d4 + (v - 1U) * 4);
    *(int *)(&PTR_typeinfo_002734b8)[v] = iVar6;
    Fl_Preferences::set(&fluid_prefs,&DAT_002141d4 + iVar2,iVar6);
    pFVar7 = Fl_Type::first;
  }
  for (; pFVar7 != (Fl_Type *)0x0; pFVar7 = pFVar7->next) {
    iVar3 = (*pFVar7->_vptr_Fl_Type[0x21])(pFVar7);
    iVar2 = gridy;
    iVar6 = gridx;
    if (iVar3 != 0) {
      this = (Fl_Window *)pFVar7[1].prev;
      iVar4 = Fl::w();
      iVar5 = Fl::h();
      iVar1 = gridy;
      iVar3 = gridx;
      this->minw = iVar6;
      this->minh = iVar2;
      this->maxw = iVar4;
      this->maxh = iVar5;
      this->dw = iVar3;
      this->dh = iVar1;
      this->aspect = 0;
      Fl_Window::size_range_(this);
    }
  }
  return;
}

Assistant:

void grid_cb(Fl_Int_Input *i, long v) {
  int n = atoi(i->value());
  if (n < 0) n = 0;
  switch (v) {
    case 1:
      gridx = n;
      fluid_prefs.set("gridx", n);
      break;
    case 2:
      gridy = n;
      fluid_prefs.set("gridy", n);
      break;
    case 3:
      snap = n;
      fluid_prefs.set("snap", n);
      break;
  }

  // Next go through all of the windows in the project and set the
  // stepping for resizes...
  Fl_Type *p;
  Fl_Window_Type *w;

  for (p = Fl_Type::first; p; p = p->next) {
    if (p->is_window()) {
      w = (Fl_Window_Type *)p;
      ((Fl_Window *)(w->o))->size_range(gridx, gridy,
                                        Fl::w(), Fl::h(),
                                        gridx, gridy, 0);
    }
  }
}